

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  string *psVar1;
  size_t sVar2;
  ostream *poVar3;
  char *extraout_RDX;
  char *pcVar4;
  char *__s;
  CheckOpMessageBuilder aCStack_1a8 [112];
  ios_base aiStack_138 [264];
  char *pcStack_30;
  char acStack_18 [16];
  
  __s = acStack_18;
  pcVar4 = (char *)(this->elements_int & 0xfffffffffffffff8);
  if (pcVar4 == (char *)0x0) {
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,void_const*>
                       ((char *)0x0,(void *)0x0,"ret != nullptr");
  }
  else {
    psVar1 = (string *)0x0;
  }
  if (psVar1 == (string *)0x0) {
    return pcVar4;
  }
  elements();
  pcStack_30 = pcVar4;
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder
            (aCStack_1a8,extraout_RDX);
  if (__s == (char *)0x0) {
    __s = (char *)&absl::lts_20240722::log_internal::kCharNull;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aCStack_1a8,__s,sVar2);
  poVar3 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  absl::lts_20240722::log_internal::MakeCheckOpValueString(poVar3,psVar1);
  pcVar4 = (char *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aCStack_1a8);
  std::ios_base::~ios_base(aiStack_138);
  return pcVar4;
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }